

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_type fs_parent(char *path,char *result,size_type buffer_size)

{
  size_t sVar1;
  size_type sVar2;
  string_view s;
  string_view path_00;
  string local_40;
  
  sVar1 = strlen(path);
  path_00._M_str = path;
  path_00._M_len = sVar1;
  fs_parent_abi_cxx11_(&local_40,path_00);
  s._M_str = local_40._M_dataplus._M_p;
  s._M_len = local_40._M_string_length;
  sVar2 = fs_str2char(s,result,buffer_size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return sVar2;
}

Assistant:

std::string::size_type fs_parent(const char* path,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_parent(path), result, buffer_size);
}